

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
          (TextureCubeArrayFormatCase *this,TestContext *testCtx,RenderContext *renderCtx,
          ContextInfo *renderCtxInfo,char *name,char *description,deUint32 format,deUint32 dataType,
          int size,int depth)

{
  TestLog *log;
  ContextType type;
  GLSLVersion glslVersion;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeArrayFormatCase_0215aeb0;
  this->m_renderCtx = renderCtx;
  this->m_renderCtxInfo = renderCtxInfo;
  this->m_format = format;
  this->m_dataType = dataType;
  this->m_size = size;
  this->m_depth = depth;
  this->m_texture = (TextureCubeArray *)0x0;
  log = testCtx->m_log;
  type.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])(renderCtx);
  glslVersion = glu::getContextTypeGLSLVersion(type);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,renderCtx,log,glslVersion,PRECISION_HIGHP);
  this->m_curLayerFace = 0;
  return;
}

Assistant:

TextureCubeArrayFormatCase::TextureCubeArrayFormatCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const glu::ContextInfo& renderCtxInfo, const char* name, const char* description, deUint32 format, deUint32 dataType, int size, int depth)
	: TestCase			(testCtx, name, description)
	, m_renderCtx		(renderCtx)
	, m_renderCtxInfo	(renderCtxInfo)
	, m_format			(format)
	, m_dataType		(dataType)
	, m_size			(size)
	, m_depth			(depth)
	, m_texture			(DE_NULL)
	, m_renderer		(renderCtx, testCtx.getLog(), glu::getContextTypeGLSLVersion(renderCtx.getType()), glu::PRECISION_HIGHP)
	, m_curLayerFace	(0)
{
}